

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

int __thiscall Clasp::ClaspFacade::SolveData::init(SolveData *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  int extraout_EAX;
  int iVar2;
  long *in_RDX;
  long *plVar3;
  EVP_PKEY_CTX *pEVar4;
  
  uVar1 = (this->en).ptr_;
  plVar3 = (long *)(uVar1 & 0xfffffffffffffffe);
  if (((uVar1 & 1) != 0 && plVar3 != in_RDX) &&
     ((this->en).ptr_ = (uintp)plVar3, plVar3 != (long *)0x0)) {
    (**(code **)(*plVar3 + 8))();
  }
  (this->en).ptr_ = (ulong)in_RDX | 1;
  uVar1 = (this->algo).ptr_;
  pEVar4 = (EVP_PKEY_CTX *)(uVar1 & 0xfffffffffffffffe);
  if (((uVar1 & 1) != 0 && pEVar4 != ctx) &&
     ((this->algo).ptr_ = (uintp)pEVar4, pEVar4 != (EVP_PKEY_CTX *)0x0)) {
    (**(code **)(*(long *)pEVar4 + 8))();
  }
  (this->algo).ptr_ = (ulong)ctx | 1;
  SolveAlgorithm::setEnumerator
            ((SolveAlgorithm *)((ulong)ctx & 0xfffffffffffffffe),
             (Enumerator *)((this->en).ptr_ & 0xfffffffffffffffe));
  if (this->interruptible == true) {
    iVar2 = (**(code **)(*(long *)((this->algo).ptr_ & 0xfffffffffffffffe) + 0x20))();
    return iVar2;
  }
  return extraout_EAX;
}

Assistant:

void ClaspFacade::SolveData::init(SolveAlgorithm* a, Enumerator* e) {
	en = e;
	algo = a;
	algo->setEnumerator(*en);
	if (interruptible) {
		this->algo->enableInterrupts();
	}
}